

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O1

cn_cbor * cn_cbor_mapget_string(cn_cbor *cb,char *key)

{
  cn_cbor *pcVar1;
  int iVar2;
  size_t sVar3;
  cn_cbor *pcVar4;
  
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0x24,"cn_cbor *cn_cbor_mapget_string(const cn_cbor *, const char *)");
  }
  if (key == (char *)0x0) {
    __assert_fail("key",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0x25,"cn_cbor *cn_cbor_mapget_string(const cn_cbor *, const char *)");
  }
  sVar3 = strlen(key);
  pcVar4 = cb->first_child;
  if (pcVar4 != (cn_cbor *)0x0) {
    do {
      pcVar1 = pcVar4->next;
      if (pcVar1 == (cn_cbor *)0x0) {
        return (cn_cbor *)0x0;
      }
      if ((((pcVar4->type & ~CN_CBOR_TRUE) == CN_CBOR_BYTES) && (pcVar4->length == (int)sVar3)) &&
         (iVar2 = bcmp(key,(pcVar4->v).bytes,(long)(int)sVar3), iVar2 == 0)) {
        return pcVar1;
      }
      pcVar4 = pcVar1->next;
    } while (pcVar4 != (cn_cbor *)0x0);
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_mapget_string(const cn_cbor* cb, const char* key) {
  cn_cbor *cp;
  int keylen;
  assert(cb);
  assert(key);
  keylen = strlen(key);
  for (cp = cb->first_child; cp && cp->next; cp = cp->next->next) {
    switch(cp->type) {
    case CN_CBOR_TEXT: // fall-through
    case CN_CBOR_BYTES:
      if (keylen != cp->length) {
        continue;
      }
      if (memcmp(key, cp->v.str, keylen) == 0) {
        return cp->next;
      }
    default:
      ; // skip non-string keys
    }
  }
  return NULL;
}